

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

size_t __thiscall
SGParser::Generator::GrammarOutputC::CreateProductionSwitch
          (GrammarOutputC *this,String *str,String *className,String *stackName,String *prefix,
          String *enumClassName)

{
  pointer *this_00;
  value_type pPVar1;
  uint uVar2;
  __type_conflict _Var3;
  bool bVar4;
  ulong uVar5;
  reference ppPVar6;
  mapped_type *ppbVar7;
  uint *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  byte local_43a;
  allocator<char> local_439;
  string local_438 [32];
  String local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  value_type local_3d8;
  String *productionName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  uint local_2e4;
  undefined1 local_2e0 [4];
  uint k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined4 local_25c;
  size_type local_258;
  size_t i;
  size_t sameNameCounter;
  size_t size;
  vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
  prods;
  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  grammarSymbolsInv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [8];
  String dest;
  allocator<char> local_61;
  undefined1 local_60 [8];
  String tab;
  String *enumClassName_local;
  String *prefix_local;
  String *stackName_local;
  String *className_local;
  String *str_local;
  GrammarOutputC *this_local;
  
  if ((this->super_GrammarOutput).pGrammar == (Grammar *)0x0) {
    this_local = (GrammarOutputC *)0x0;
  }
  else {
    tab.field_2._8_8_ = enumClassName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"    ",&local_61);
    std::allocator<char>::~allocator(&local_61);
    std::__cxx11::string::string(local_98);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::operator+(&local_d8,"namespace ",&this->namespaceName);
      std::operator+(&local_b8,&local_d8,"\n{\n\n");
      std::__cxx11::string::operator+=(local_98,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::operator+(&local_158,"bool ",className);
    std::operator+(&local_138,&local_158,"::Reduce(Parse<");
    std::operator+(&local_118,&local_138,stackName);
    std::operator+(&local_f8,&local_118,"> &parse, unsigned productionID)\n{\n");
    std::__cxx11::string::operator+=(local_98,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    if ((this->useEnumClasses & 1U) == 0) {
      std::operator+(&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "switch (productionID)\n");
      std::__cxx11::string::operator+=(local_98,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    else {
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "switch (static_cast<");
      std::operator+(&local_198,&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     tab.field_2._8_8_);
      std::operator+(&local_178,&local_198,">(productionID))\n");
      std::__cxx11::string::operator+=(local_98,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   "{\n");
    std::__cxx11::string::operator+=
              (local_98,(string *)
                        &grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string
              ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_00 = &prods.
               super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
    ::map((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           *)this_00);
    Grammar::GetInverseGrammarSymbols
              ((this->super_GrammarOutput).pGrammar,
               (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                *)this_00);
    std::
    vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>::
    vector((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
            *)&size);
    sameNameCounter =
         Grammar::CreateProductionVector
                   ((this->super_GrammarOutput).pGrammar,
                    (vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                     *)&size);
    i = 1;
    for (local_258 = 1; local_258 < sameNameCounter; local_258 = local_258 + 1) {
      std::
      vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
      ::operator[]((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                    *)&size,local_258);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        this_local = (GrammarOutputC *)0x0;
        goto LAB_0014b1e3;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                     "// ");
      ppPVar6 = std::
                vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                ::operator[]((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                              *)&size,local_258);
      ppbVar7 = std::
                map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                ::operator[]((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                              *)&prods.
                                 super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             &(*ppPVar6)->Left);
      std::operator+(&local_2a0,&local_2c0,*ppbVar7);
      std::operator+(&local_280,&local_2a0," -> ");
      std::__cxx11::string::operator+=(local_98,(string *)&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)local_2e0);
      ppPVar6 = std::
                vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                ::operator[]((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                              *)&size,local_258);
      if ((*ppPVar6)->Length == 0) {
        std::__cxx11::string::operator+=(local_98,"<empty>");
      }
      else {
        for (local_2e4 = 0; uVar2 = local_2e4,
            ppPVar6 = std::
                      vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                      ::operator[]((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                                    *)&size,local_258), uVar2 < (*ppPVar6)->Length;
            local_2e4 = local_2e4 + 1) {
          ppPVar6 = std::
                    vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                    ::operator[]((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                                  *)&size,local_258);
          puVar8 = Production::Right(*ppPVar6,local_2e4);
          if ((*puVar8 & 0x80000000) == 0) {
            ppPVar6 = std::
                      vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                      ::operator[]((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                                    *)&size,local_258);
            puVar8 = Production::Right(*ppPVar6,local_2e4);
            ppbVar7 = std::
                      map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                      ::operator[]((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                                    *)&prods.
                                       super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,puVar8);
            std::__cxx11::string::operator+=(local_98,(string *)*ppbVar7);
          }
          else {
            ppPVar6 = std::
                      vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                      ::operator[]((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                                    *)&size,local_258);
            puVar8 = Production::Right(*ppPVar6,local_2e4);
            ppbVar7 = std::
                      map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                      ::operator[]((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                                    *)&prods.
                                       super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,puVar8);
            std::operator+(&local_328,"\'",*ppbVar7);
            std::operator+(&local_308,&local_328,"\'");
            std::__cxx11::string::operator+=(local_98,(string *)&local_308);
            std::__cxx11::string::~string((string *)&local_308);
            std::__cxx11::string::~string((string *)&local_328);
          }
          std::__cxx11::string::operator+=(local_98," ");
        }
      }
      std::__cxx11::string::operator+=(local_98,"\n");
      std::operator+(&local_388,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_368,&local_388,"case ");
      productionName._7_1_ = 0;
      if ((this->useEnumClasses & 1U) == 0) {
        std::__cxx11::string::string((string *)&local_3a8,(string *)prefix);
      }
      else {
        std::operator+(&local_3c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       tab.field_2._8_8_,"::");
        productionName._7_1_ = 1;
        std::operator+(&local_3a8,&local_3c8,prefix);
      }
      std::operator+(&local_348,&local_368,&local_3a8);
      std::__cxx11::string::operator+=(local_98,(string *)&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_3a8);
      if ((productionName._7_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_3c8);
      }
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      ppPVar6 = std::
                vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                ::operator[]((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                              *)&size,local_258);
      pPVar1 = *ppPVar6;
      local_3d8 = pPVar1;
      ppPVar6 = std::
                vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                ::operator[]((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                              *)&size,local_258 - 1);
      _Var3 = std::operator==(&pPVar1->Name,&(*ppPVar6)->Name);
      pPVar1 = local_3d8;
      if (_Var3) {
        i = i + 1;
        StringWithFormat<char>(&local_418,"%u",i);
        std::operator+(&local_3f8,&pPVar1->Name,&local_418);
        std::__cxx11::string::operator+=(local_98,(string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_418);
      }
      else {
        i = 1;
        local_43a = 0;
        bVar4 = std::operator==(&local_3d8->Name,"[Accept9]");
        if (bVar4) {
          std::allocator<char>::allocator();
          local_43a = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_438,"AcceptPVMRoot",&local_439);
        }
        else {
          std::__cxx11::string::string(local_438,(string *)local_3d8);
        }
        std::__cxx11::string::operator+=(local_98,local_438);
        std::__cxx11::string::~string(local_438);
        if ((local_43a & 1) != 0) {
          std::allocator<char>::~allocator(&local_439);
        }
      }
      std::operator+(&local_4c0,":\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_4a0,&local_4c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_480,&local_4a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_460,&local_480,"break;\n\n");
      std::__cxx11::string::operator+=(local_98,(string *)&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4c0);
    }
    std::operator+(&local_540,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   "}\n");
    std::operator+(&local_520,&local_540,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::operator+(&local_500,&local_520,"return true;\n");
    std::operator+(&local_4e0,&local_500,"}\n");
    std::__cxx11::string::operator+=(local_98,(string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_540);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::operator+(&local_580,"\n} // namespace ",&this->namespaceName);
      std::operator+(&local_560,&local_580,"\n");
      std::__cxx11::string::operator+=(local_98,(string *)&local_560);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&local_580);
    }
    std::
    map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
    ::clear((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
             *)&prods.
                super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::swap((string *)str);
    this_local = (GrammarOutputC *)sameNameCounter;
LAB_0014b1e3:
    local_25c = 1;
    std::
    vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>::
    ~vector((vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
             *)&size);
    std::
    map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
    ::~map((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            *)&prods.
               super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)local_60);
  }
  return (size_t)this_local;
}

Assistant:

size_t GrammarOutputC::CreateProductionSwitch(String& str, const String& className,
                                              const String& stackName, const String& prefix,
                                              const String& enumClassName) const {
    if (!pGrammar)
        return 0u;

    const String tab = "    ";
    String dest;

    // Begin namespace declaration of needed
    if (!namespaceName.empty())
        dest += "namespace " + namespaceName + "\n{\n\n";

    // *** Function declaration

    dest += "bool " + className + "::Reduce(Parse<" + stackName +
            "> &parse, unsigned productionID)\n{\n";

    // *** Switch statement declaration

    if (useEnumClasses)
        dest += tab + "switch (static_cast<" + enumClassName + ">(productionID))\n";
    else
        dest += tab + "switch (productionID)\n";

    dest += tab + "{\n";

    // *** Case statements

    // Create inverse symbols for string lookup
    std::map<unsigned, const String*> grammarSymbolsInv;
    pGrammar->GetInverseGrammarSymbols(grammarSymbolsInv);

    // Go through productions and assign pointers
    std::vector<Production*> prods;
    const auto size = pGrammar->CreateProductionVector(prods);

    // If there are multiple productions with the same name,
    // this counter will be used to generate different labels for them
    size_t sameNameCounter = 1u;

    // Go through the productions and build case statements
    // Starting from the 2nd, the first is always Accept
    for (size_t i = 1u; i < size; ++i) {
        // Return immediately in case of the empty production name
        if (prods[i]->Name.empty())
            return 0u;

        // Store the comment
        dest += tab + tab + "// " + *grammarSymbolsInv[prods[i]->Left] + " -> ";

        if (prods[i]->Length > 0u) {
            for (unsigned k = 0u; k < prods[i]->Length; ++k) {
                if (prods[i]->Right(k) & ProductionMask::Terminal)
                    dest += "'" + *grammarSymbolsInv[prods[i]->Right(k)] + "'";
                else
                    dest += *grammarSymbolsInv[prods[i]->Right(k)];
                dest += " ";
            }
        } else {
            dest += "<empty>";
        }

        dest += "\n";

        // Store the case statements
        dest += tab + tab + "case " + (useEnumClasses ? enumClassName + "::" + prefix : prefix);

        const auto& productionName = prods[i]->Name;

        // If there are multiple productions with the same name,
        // generate different labels for them
        if (productionName == prods[i - 1u]->Name) {
            ++sameNameCounter;
            dest += productionName + StringWithFormat("%u", sameNameCounter);
        } else {
            sameNameCounter = 1u;
            // Check why this special case exists
            dest += productionName == "[Accept9]" ? String{"AcceptPVMRoot"} : productionName;
        }

        dest += ":\n" + tab + tab + tab + "break;\n\n";
    }

    dest += tab + "}\n" + tab + "return true;\n" + "}\n";

    // Close namespace declaration of needed
    if (!namespaceName.empty())
        dest += "\n} // namespace " + namespaceName + "\n";

    // Clear the grammar symbol table because it did not originally exist
    grammarSymbolsInv.clear();

    str.swap(dest);

    return size;
}